

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void handle_struct_assign(Vm *vm)

{
  TokenType TVar1;
  OP_CODE op_code;
  OP_CODE OStack_10;
  
  TVar1 = (vm->compiler).token.type;
  if (TVar1 == TOKEN_PLUS_PLUS) {
    advance(vm);
    emit_no_arg(vm,OP_STRUCT_PEEK);
    emit_no_arg(vm,OP_LDC_1);
    op_code = OP_ADD;
LAB_00105359:
    emit_no_arg(vm,op_code);
  }
  else {
    if (TVar1 == TOKEN_MINUS_MINUS) {
      advance(vm);
      emit_no_arg(vm,OP_STRUCT_PEEK);
      emit_no_arg(vm,OP_LDC_1);
      op_code = OP_SUB;
      goto LAB_00105359;
    }
    if (TVar1 != TOKEN_EQUALS) {
      OStack_10 = OP_STRUCT_GET;
      goto LAB_00105368;
    }
    advance(vm);
    expr(vm);
  }
  OStack_10 = OP_STRUCT_SET;
LAB_00105368:
  emit_no_arg(vm,OStack_10);
  return;
}

Assistant:

static void handle_struct_assign(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_EQUALS:
            advance(vm);
            expr(vm);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        case TOKEN_PLUS_PLUS:
            advance(vm);
            emit_no_arg(vm, OP_STRUCT_PEEK);
            emit_no_arg(vm, OP_LDC_1);
            emit_no_arg(vm, OP_ADD);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        case TOKEN_MINUS_MINUS:
            advance(vm);
            emit_no_arg(vm, OP_STRUCT_PEEK);
            emit_no_arg(vm, OP_LDC_1);
            emit_no_arg(vm, OP_SUB);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        default:
            emit_no_arg(vm, OP_STRUCT_GET);
            break;
    }
}